

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::AddLocationAndComponentDecorations
          (InterfaceVariableScalarReplacement *this,NestedCompositeComponents *vars,
          uint32_t *location,uint32_t component)

{
  pointer pNVar1;
  uint32_t var_id;
  DecorationManager *pDVar2;
  const_iterator __begin2;
  pointer vars_00;
  
  vars_00 = (vars->nested_composite_components).
            super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (vars->nested_composite_components).
           super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (vars_00 == pNVar1) {
    var_id = Instruction::result_id(vars->component_variable);
    pDVar2 = IRContext::get_decoration_mgr((this->super_Pass).context_);
    anon_unknown_0::CreateDecoration(pDVar2,var_id,Location,*location);
    pDVar2 = IRContext::get_decoration_mgr((this->super_Pass).context_);
    anon_unknown_0::CreateDecoration(pDVar2,var_id,Component,component);
    *location = *location + 1;
  }
  else {
    for (; vars_00 != pNVar1; vars_00 = vars_00 + 1) {
      AddLocationAndComponentDecorations(this,vars_00,location,component);
    }
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::AddLocationAndComponentDecorations(
    const NestedCompositeComponents& vars, uint32_t* location,
    uint32_t component) {
  if (!vars.HasMultipleComponents()) {
    uint32_t var_id = vars.GetComponentVariable()->result_id();
    CreateDecoration(context()->get_decoration_mgr(), var_id,
                     spv::Decoration::Location, *location);
    CreateDecoration(context()->get_decoration_mgr(), var_id,
                     spv::Decoration::Component, component);
    ++(*location);
    return;
  }
  for (const auto& var : vars.GetComponents()) {
    AddLocationAndComponentDecorations(var, location, component);
  }
}